

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,QStringBuilder<char16_t,_QString_&> *b)

{
  ArrayOptions *pAVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  char16_t *__src;
  
  pDVar3 = (a->d).d;
  lVar4 = (a->d).size;
  lVar5 = (b->b->d).size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar4);
  }
  lVar4 = lVar4 + lVar5 + 1;
  pDVar3 = (a->d).d;
  if (pDVar3 == (Data *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (pDVar3->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar5 < lVar4) {
    if (pDVar3 == (Data *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (pDVar3->super_QArrayData).alloc * 2;
    }
    if (lVar5 < lVar4) {
      lVar5 = lVar4;
    }
    if (((pDVar3 == (Data *)0x0) ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar3->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar5)) {
      lVar4 = (a->d).size;
      if (lVar5 < lVar4) {
        lVar5 = lVar4;
      }
      QString::reallocData((longlong)a,(AllocationOption)lVar5);
    }
    pDVar3 = (a->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  pcVar2 = (a->d).ptr + (a->d).size;
  *pcVar2 = b->a;
  lVar4 = (b->b->d).size;
  if (lVar4 != 0) {
    __src = (b->b->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar2 + 1,__src,lVar4 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}